

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

int ctemplate_htmlparser::js_is_whitespace(char c)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,c);
  if (((0x20 < uVar1) || ((0x100001e00U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (uVar1 != 0xffffffa0)) {
    return (int)(c == '\r');
  }
  return 1;
}

Assistant:

static inline int js_is_whitespace(char c)
{
  return c == '\t' ||   /* Tab 0x09 */
         c == '\v' ||   /* Vertical Tab 0x0B */
         c == '\f' ||   /* Form Feed 0x0C */
         c == ' ' ||    /* Space 0x20 */
         c == '\xa0' || /* No-Break Space 0xA0 */
         c == '\n' ||   /* line Feed 0x0A */
         c == '\r';     /* Carriage Return 0x0D */
}